

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void diff_ordset_free(ly_set *set)

{
  lys_node *__ptr;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (set != (ly_set *)0x0) {
    if (set->number != 0) {
      uVar3 = 0;
      do {
        __ptr = (set->set).s[uVar3];
        if (*(int *)&__ptr->ref != 0) {
          lVar1 = 0x10;
          uVar2 = 0;
          do {
            free(*(void **)(*(long *)&__ptr->flags + lVar1));
            uVar2 = uVar2 + 1;
            lVar1 = lVar1 + 0x18;
          } while (uVar2 < *(uint *)&__ptr->ref);
        }
        free(*(void **)&__ptr->flags);
        free(__ptr);
        uVar3 = uVar3 + 1;
      } while (uVar3 < set->number);
    }
    free((set->set).s);
    free(set);
    return;
  }
  return;
}

Assistant:

static void
diff_ordset_free(struct ly_set *set)
{
    unsigned int i, j;
    struct diff_ordered *ord;

    if (!set) {
        return;
    }

    for (i = 0; i < set->number; i++) {
        ord = (struct diff_ordered *)set->set.g[i];
        for (j = 0; j < ord->count; j++) {
            free(ord->items[j].dist);
        }
        free(ord->items);
        free(ord);
    }

    ly_set_free(set);
}